

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl_trc.c
# Opt level: O1

void trc_infof(Curl_easy *data,curl_trc_feat *feat,char *opt_id,int opt_id_idx,char *fmt,
              __va_list_tag *ap)

{
  curl_trc_feat *pcVar1;
  int iVar2;
  ulong uVar3;
  char *ptr;
  size_t sVar4;
  char buf [2048];
  char local_838 [2056];
  
  if (((data->set).field_0x89f & 0x40) == 0) {
LAB_001230c3:
    sVar4 = 0;
  }
  else {
    pcVar1 = (data->state).feat;
    if (pcVar1 == (curl_trc_feat *)0x0) {
      if (Curl_trc_feat_ids.log_level < 1) goto LAB_001230c3;
    }
    else {
      sVar4 = 0;
      if ((pcVar1->log_level < 1) || (Curl_trc_feat_ids.log_level < 1)) goto LAB_00123101;
    }
    sVar4 = trc_print_ids(data,local_838,(size_t)opt_id);
  }
LAB_00123101:
  if (feat != (curl_trc_feat *)0x0) {
    iVar2 = curl_msnprintf(local_838 + sVar4,0x800 - sVar4,"[%s] ",feat->name);
    sVar4 = sVar4 + (long)iVar2;
  }
  if (opt_id != (char *)0x0) {
    if (opt_id_idx < 1) {
      iVar2 = curl_msnprintf(local_838 + sVar4,0x800 - sVar4,"[%s] ",opt_id);
    }
    else {
      iVar2 = curl_msnprintf(local_838 + sVar4,0x800 - sVar4,"[%s-%d] ",opt_id,
                             (ulong)(uint)opt_id_idx);
    }
    sVar4 = sVar4 + (long)iVar2;
  }
  iVar2 = curl_mvsnprintf(local_838 + sVar4,0x800 - sVar4,fmt,ap);
  uVar3 = (long)iVar2 + sVar4;
  if (uVar3 < 0x7fe) {
    local_838[uVar3] = '\n';
    ptr = (char *)(uVar3 + 1);
  }
  else {
    builtin_strncpy(local_838 + 0x7fb,"...\n",4);
    ptr = (char *)0x7ff;
  }
  local_838[(long)ptr] = '\0';
  trc_write(data,(curl_infotype)local_838,ptr,(size_t)ap);
  return;
}

Assistant:

static void trc_infof(struct Curl_easy *data,
                      struct curl_trc_feat *feat,
                      const char *opt_id, int opt_id_idx,
                      const char * const fmt, va_list ap)
{
  size_t len = 0;
  char buf[TRC_LINE_MAX];

  if(CURL_TRC_IDS(data))
    len += trc_print_ids(data, buf + len, TRC_LINE_MAX - len);
  if(feat)
    len += msnprintf(buf + len, TRC_LINE_MAX - len, "[%s] ", feat->name);
  if(opt_id) {
    if(opt_id_idx > 0)
      len += msnprintf(buf + len, TRC_LINE_MAX - len, "[%s-%d] ",
                       opt_id, opt_id_idx);
    else
      len += msnprintf(buf + len, TRC_LINE_MAX - len, "[%s] ", opt_id);
  }
  len += mvsnprintf(buf + len, TRC_LINE_MAX - len, fmt, ap);
  len = trc_end_buf(buf, len, TRC_LINE_MAX, TRUE);
  trc_write(data, CURLINFO_TEXT, buf, len);
}